

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint Extra_TruthCanonP(uint uTruth,int nVars)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (Extra_TruthCanonP::pPerms != (char **)0x0) {
    if (Extra_TruthCanonP::nVarsOld == nVars) goto LAB_003892fb;
    free(Extra_TruthCanonP::pPerms);
    Extra_TruthCanonP::pPerms = (char **)0x0;
  }
  Extra_TruthCanonP::nPerms = Extra_Factorial(nVars);
  Extra_TruthCanonP::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonP::nVarsOld = nVars;
LAB_003892fb:
  uVar2 = 0xffffffff;
  for (lVar3 = 0; lVar3 < Extra_TruthCanonP::nPerms; lVar3 = lVar3 + 1) {
    uVar1 = Extra_TruthPermute(uTruth,Extra_TruthCanonP::pPerms[lVar3],nVars,0);
    if (uVar1 <= uVar2) {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned Extra_TruthCanonP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPerm;
    int k;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    uTruthMin = 0xFFFFFFFF;
    for ( k = 0; k < nPerms; k++ )
    {
        uPerm = Extra_TruthPermute( uTruth, pPerms[k], nVars, 0 );
        if ( uTruthMin > uPerm )
            uTruthMin = uPerm;
    }
    return uTruthMin;
}